

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_server_main.cpp
# Opt level: O2

void __thiscall settings::setup(settings *this,value *v)

{
  cppcms_session_storage_generator_type p_Var1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  session_file_storage_factory *__p;
  session_memory_storage_factory *this_00;
  value *pvVar6;
  session_storage_factory *__p_00;
  cppcms_error *pcVar7;
  string *this_01;
  string error;
  string dir;
  string stor;
  string module;
  string entry_point;
  cppcms_session_storage_generator_type f;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cppcms::json::value::get_abi_cxx11_(&stor,v,"ip","0.0.0.0");
  std::__cxx11::string::operator=((string *)this,(string *)&stor);
  std::__cxx11::string::~string((string *)&stor);
  iVar4 = cppcms::json::value::get<int>(v,"port");
  this->port = iVar4;
  stor._M_dataplus._M_p._0_4_ = std::thread::hardware_concurrency();
  uVar5 = cppcms::json::value::get<unsigned_int>(v,"threads",(uint *)&stor);
  this->threads = uVar5;
  stor._M_dataplus._M_p._0_4_ = 0xffffffff;
  iVar4 = cppcms::json::value::get<int>(v,"cache.limit",(int *)&stor);
  if (iVar4 != -1) {
    cppcms::impl::thread_cache_factory((uint)&stor);
    booster::intrusive_ptr<cppcms::impl::base_cache>::operator=
              (&this->cache,(intrusive_ptr<cppcms::impl::base_cache> *)&stor);
    booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
              ((intrusive_ptr<cppcms::impl::base_cache> *)&stor);
  }
  stor._M_dataplus._M_p._0_4_ = 10;
  iVar4 = cppcms::json::value::get<int>(v,"session.gc",(int *)&stor);
  this->gc = iVar4;
  cppcms::json::value::get_abi_cxx11_(&stor,v,"session.storage","");
  if (stor._M_string_length != 0) {
    bVar2 = std::operator==(&stor,"files");
    if (bVar2) {
      cppcms::json::value::get_abi_cxx11_(&dir,v,"session.dir","");
      __p = (session_file_storage_factory *)operator_new(0x18);
      std::__cxx11::string::string((string *)&local_80,(string *)&dir);
      cppcms::sessions::session_file_storage_factory::session_file_storage_factory
                (__p,&local_80,this->threads,1,0);
      std::__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>::
      reset<cppcms::sessions::session_file_storage_factory>
                (&(this->sessions).
                  super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
                 ,__p);
      this_01 = &local_80;
    }
    else {
      bVar2 = std::operator==(&stor,"memory");
      if (bVar2) {
        this_00 = (session_memory_storage_factory *)operator_new(0x18);
        cppcms::sessions::session_memory_storage_factory::session_memory_storage_factory(this_00);
        std::__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>::
        reset<cppcms::sessions::session_memory_storage_factory>
                  (&(this->sessions).
                    super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
                   ,this_00);
        goto LAB_00106e92;
      }
      bVar2 = std::operator==(&stor,"external");
      if (!bVar2) {
        pcVar7 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::operator+(&dir,"Unknown session.storage:",&stor);
        cppcms::cppcms_error::cppcms_error(pcVar7,&dir);
        __cxa_throw(pcVar7,&cppcms::cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      std::__cxx11::string::string((string *)&module,"",(allocator *)&entry_point);
      cppcms::json::value::get<std::__cxx11::string>(&dir,v,"session.shared_object",&module);
      std::__cxx11::string::~string((string *)&module);
      std::__cxx11::string::string((string *)&entry_point,"",(allocator *)&error);
      cppcms::json::value::get<std::__cxx11::string>(&module,v,"session.module",&entry_point);
      std::__cxx11::string::~string((string *)&entry_point);
      std::__cxx11::string::string((string *)&error,"sessions_generator",(allocator *)&f);
      cppcms::json::value::get<std::__cxx11::string>(&entry_point,v,"session.entry_point",&error);
      std::__cxx11::string::~string((string *)&error);
      if (dir._M_string_length == 0) {
        if (module._M_string_length == 0) {
          pcVar7 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&error,
                     "session.storage=external and neither session.shared_object nor session.module is defined"
                     ,(allocator *)&f);
          cppcms::cppcms_error::cppcms_error(pcVar7,&error);
          __cxa_throw(pcVar7,&cppcms::cppcms_error::typeinfo,booster::runtime_error::~runtime_error)
          ;
        }
        booster::shared_object::name((string *)&error);
        std::__cxx11::string::operator=((string *)&dir,(string *)&error);
        std::__cxx11::string::~string((string *)&error);
      }
      else if (module._M_string_length != 0) {
        pcVar7 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&error,"both session.shared_object and session.module are defined",
                   (allocator *)&f);
        cppcms::cppcms_error::cppcms_error(pcVar7,&error);
        __cxa_throw(pcVar7,&cppcms::cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      error._M_dataplus._M_p = (pointer)&error.field_2;
      error._M_string_length = 0;
      error.field_2._M_local_buf[0] = '\0';
      cVar3 = booster::shared_object::open((string *)&this->plugin,(string *)&dir);
      if (cVar3 == '\0') {
        pcVar7 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::operator+(&local_60,"sessions_pool: failed to load shared object ",&dir);
        std::operator+(&local_40,&local_60,": ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                       &local_40,&error);
        cppcms::cppcms_error::cppcms_error(pcVar7,(string *)&f);
        __cxa_throw(pcVar7,&cppcms::cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      f = (cppcms_session_storage_generator_type)0x0;
      booster::shared_object::
      symbol<cppcms::sessions::session_storage_factory*(*)(cppcms::json::value_const&)>
                (&this->plugin,&f,&entry_point);
      p_Var1 = f;
      pvVar6 = (value *)cppcms::json::value::find((char *)v);
      __p_00 = (*p_Var1)(pvVar6);
      std::__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>::
      reset<cppcms::sessions::session_storage_factory>
                (&(this->sessions).
                  super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
                 ,__p_00);
      std::__cxx11::string::~string((string *)&error);
      std::__cxx11::string::~string((string *)&entry_point);
      this_01 = &module;
    }
    std::__cxx11::string::~string((string *)this_01);
    std::__cxx11::string::~string((string *)&dir);
  }
LAB_00106e92:
  if ((this->cache).p_ != (base_cache *)0x0 ||
      (this->sessions).
      super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    std::__cxx11::string::~string((string *)&stor);
    return;
  }
  pcVar7 = (cppcms_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&dir,"Neither cache.limit nor session.storage is defined",
             (allocator *)&module);
  cppcms::cppcms_error::cppcms_error(pcVar7,&dir);
  __cxa_throw(pcVar7,&cppcms::cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void setup(cppcms::json::value const &v)
	{		
		ip=v.get("ip","0.0.0.0");
		port=v.get<int>("port");
		threads=v.get("threads",booster::thread::hardware_concurrency());
		int items = v.get("cache.limit",-1);
		if(items!=-1){
			cache = cppcms::impl::thread_cache_factory(items);
		}
		gc=v.get("session.gc",10);
		std::string stor = v.get("session.storage","");
		if(!stor.empty()) {
			#ifndef CPPCMS_NO_GZIP
			if(stor == "files") {
				std::string dir = v.get("session.dir","");
				#ifdef CPPCMS_WIN_NATIVE
				sessions.reset(new cppcms::sessions::session_file_storage_factory(dir));
				#else
				sessions.reset(new cppcms::sessions::session_file_storage_factory(dir,threads,1,false));
				#endif
			}
			else 
			#endif //CPPCMS_NO_GZIP
            if(stor == "memory") {
				sessions.reset(new cppcms::sessions::session_memory_storage_factory());
			}
			else if(stor == "external") {
				std::string so = v.get<std::string>("session.shared_object","");
				std::string module = v.get<std::string>("session.module","");
				std::string entry_point = v.get<std::string>("session.entry_point","sessions_generator");
				if(so.empty() && module.empty())
					throw cppcms::cppcms_error(
								"session.storage=external "
								"and neither session.shared_object "
								"nor session.module is defined");
				if(!so.empty() && !module.empty())
					throw cppcms::cppcms_error(
								"both session.shared_object "
								"and session.module are defined");

				if(so.empty()) {
					so = booster::shared_object::name(module);
				}
				std::string error;
				if(!plugin.open(so,error)) {
					throw cppcms::cppcms_error("sessions_pool: failed to load shared object " + so + ": " + error);
				}
				cppcms::sessions::cppcms_session_storage_generator_type f=0;
				plugin.symbol(f,entry_point);
				sessions.reset(f(v.find("session.settings")));
			}
			else 
				throw cppcms::cppcms_error("Unknown session.storage:"+stor);
		}
		if(!sessions && !cache) {
			throw cppcms::cppcms_error("Neither cache.limit nor session.storage is defined");
		}
	}